

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int langidFromSelect(Fts3Table *p,sqlite3_stmt *pSelect)

{
  int local_1c;
  int iLangid;
  sqlite3_stmt *pSelect_local;
  Fts3Table *p_local;
  
  local_1c = 0;
  if (p->zLanguageid != (char *)0x0) {
    local_1c = sqlite3_column_int(pSelect,p->nColumn + 1);
  }
  return local_1c;
}

Assistant:

static int langidFromSelect(Fts3Table *p, sqlite3_stmt *pSelect){
  int iLangid = 0;
  if( p->zLanguageid ) iLangid = sqlite3_column_int(pSelect, p->nColumn+1);
  return iLangid;
}